

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O1

pair<const_void_*const_*,_bool> __thiscall
llvm::SmallPtrSetImplBase::insert_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  uint uVar1;
  void **ppvVar2;
  bool bVar3;
  void **in_RAX;
  void **ppvVar4;
  ulong uVar5;
  undefined7 uVar7;
  undefined8 uVar6;
  void **ppvVar8;
  long lVar9;
  pair<const_void_*const_*,_bool> pVar10;
  
  ppvVar2 = this->SmallArray;
  if (this->CurArray == ppvVar2) {
    uVar1 = this->NumNonEmpty;
    uVar5 = (ulong)uVar1;
    if (uVar5 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      lVar9 = uVar5 * 8;
      ppvVar8 = (void **)0x0;
      ppvVar4 = ppvVar2;
      do {
        if (*ppvVar4 == Ptr) {
          uVar6 = 0;
          bVar3 = false;
          goto LAB_001719b2;
        }
        if (*ppvVar4 == (void *)0xfffffffffffffffe) {
          ppvVar8 = ppvVar4;
        }
        ppvVar4 = ppvVar4 + 1;
        lVar9 = lVar9 + -8;
      } while (lVar9 != 0);
    }
    uVar7 = (undefined7)((ulong)ppvVar2 >> 8);
    if (ppvVar8 == (void **)0x0) {
      if (uVar1 < this->CurArraySize) {
        this->NumNonEmpty = uVar1 + 1;
        ppvVar2[uVar5] = Ptr;
        uVar6 = CONCAT71(uVar7,1);
        bVar3 = false;
        ppvVar4 = this->SmallArray + uVar5;
      }
      else {
        bVar3 = true;
        uVar6 = 0;
        ppvVar4 = in_RAX;
      }
    }
    else {
      *ppvVar8 = Ptr;
      this->NumTombstones = this->NumTombstones - 1;
      uVar6 = CONCAT71(uVar7,1);
      bVar3 = false;
      ppvVar4 = ppvVar8;
    }
LAB_001719b2:
    pVar10._8_8_ = uVar6;
    pVar10.first = ppvVar4;
    if (!bVar3) {
      return pVar10;
    }
  }
  pVar10 = insert_imp_big(this,Ptr);
  return pVar10;
}

Assistant:

std::pair<const void *const *, bool> insert_imp(const void *Ptr) {
    if (isSmall()) {
      // Check to see if it is already in the set.
      const void **LastTombstone = nullptr;
      for (const void **APtr = SmallArray, **E = SmallArray + NumNonEmpty;
           APtr != E; ++APtr) {
        const void *Value = *APtr;
        if (Value == Ptr)
          return std::make_pair(APtr, false);
        if (Value == getTombstoneMarker())
          LastTombstone = APtr;
      }

      // Did we find any tombstone marker?
      if (LastTombstone != nullptr) {
        *LastTombstone = Ptr;
        --NumTombstones;
        incrementEpoch();
        return std::make_pair(LastTombstone, true);
      }

      // Nope, there isn't.  If we stay small, just 'pushback' now.
      if (NumNonEmpty < CurArraySize) {
        SmallArray[NumNonEmpty++] = Ptr;
        incrementEpoch();
        return std::make_pair(SmallArray + (NumNonEmpty - 1), true);
      }
      // Otherwise, hit the big set case, which will call grow.
    }
    return insert_imp_big(Ptr);
  }